

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

_Bool remove_file(char *filename)

{
  int iVar1;
  
  if (filename != (char *)0x0) {
    iVar1 = unlink(filename);
    if (iVar1 != 0) {
      perror("unlink");
    }
    return iVar1 == 0;
  }
  __assert_fail("filename",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/rosmanov[P]bee-host/src/io.c"
                ,0x147,"_Bool remove_file(const char *)");
}

Assistant:

bool
remove_file (const char* filename)
{
  assert (filename);
  if (unlikely (filename == NULL))
    return false;

  if (unlikely (unlink (filename)))
    {
      perror ("unlink");
      return false;
    }

  return true;
}